

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# library_module.cc
# Opt level: O1

PackedFunc *
tvm::runtime::WrapPackedFunc
          (PackedFunc *__return_storage_ptr__,TVMBackendPackedCFunc faddr,
          ObjectPtr<tvm::runtime::Object> *sptr_to_self)

{
  ObjectPtr<tvm::runtime::Object> local_40;
  _Any_data local_38;
  code *local_28;
  code *pcStack_20;
  
  local_40 = (ObjectPtr<tvm::runtime::Object>)sptr_to_self->data_;
  if (local_40.data_ != (Object *)0x0) {
    LOCK();
    ((local_40.data_)->ref_counter_).super___atomic_base<int>._M_i =
         ((local_40.data_)->ref_counter_).super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  local_28 = (code *)0x0;
  pcStack_20 = (code *)0x0;
  local_38._M_unused._M_object = (void *)0x0;
  local_38._8_8_ = 0;
  local_38._M_unused._M_object = operator_new(0x10);
  *(TVMBackendPackedCFunc *)local_38._M_unused._0_8_ = faddr;
  *(Object **)((long)local_38._M_unused._0_8_ + 8) = local_40.data_;
  if (local_40.data_ != (Object *)0x0) {
    LOCK();
    ((local_40.data_)->ref_counter_).super___atomic_base<int>._M_i =
         ((local_40.data_)->ref_counter_).super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  pcStack_20 = std::
               _Function_handler<void_(tvm::runtime::TVMArgs,_tvm::runtime::TVMRetValue_*),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/liueo[P]TVM-deploy/./tvm/src/runtime/library_module.cc:80:21)>
               ::_M_invoke;
  local_28 = std::
             _Function_handler<void_(tvm::runtime::TVMArgs,_tvm::runtime::TVMRetValue_*),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/liueo[P]TVM-deploy/./tvm/src/runtime/library_module.cc:80:21)>
             ::_M_manager;
  std::function<void_(tvm::runtime::TVMArgs,_tvm::runtime::TVMRetValue_*)>::function
            (&__return_storage_ptr__->body_,
             (function<void_(tvm::runtime::TVMArgs,_tvm::runtime::TVMRetValue_*)> *)&local_38);
  if (local_28 != (code *)0x0) {
    (*local_28)(&local_38,&local_38,__destroy_functor);
  }
  ObjectPtr<tvm::runtime::Object>::~ObjectPtr(&local_40);
  return __return_storage_ptr__;
}

Assistant:

PackedFunc WrapPackedFunc(TVMBackendPackedCFunc faddr,
                          const ObjectPtr<Object>& sptr_to_self) {
  return PackedFunc([faddr, sptr_to_self](TVMArgs args, TVMRetValue* rv) {
      TVMValue ret_value;
      int ret_type_code = kTVMNullptr;
      int ret = (*faddr)(
          const_cast<TVMValue*>(args.values),
          const_cast<int*>(args.type_codes),
          args.num_args,
          &ret_value,
          &ret_type_code);
      CHECK_EQ(ret, 0) << TVMGetLastError();
      if (ret_type_code != kTVMNullptr) {
        *rv = TVMRetValue::MoveFromCHost(ret_value, ret_type_code);
      }
    });
}